

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# font.cc
# Opt level: O2

bool woff2::WriteFont(Font *font,size_t *offset,uint8_t *dst,size_t dst_size)

{
  size_t sVar1;
  bool bVar2;
  _Base_ptr p_Var3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  bool bVar7;
  
  bVar7 = false;
  if (((ulong)font->num_tables << 4 | 0xc) <= dst_size) {
    StoreU32(font->flavor,offset,dst);
    sVar1 = *offset;
    *(uint16_t *)(dst + sVar1) = font->num_tables << 8 | font->num_tables >> 8;
    uVar4 = 0xf;
    uVar5 = (ushort)*(int *)&font->num_tables;
    if (uVar5 != 0) {
      for (; uVar5 >> uVar4 == 0; uVar4 = uVar4 - 1) {
      }
    }
    if (uVar5 == 0) {
      uVar4 = 0;
    }
    uVar5 = (ushort)(0x10 << ((byte)uVar4 & 0x1f));
    if (uVar4 == 0) {
      uVar5 = 0;
    }
    uVar6 = (short)(*(int *)&font->num_tables << 4) - uVar5;
    *(ushort *)(dst + sVar1 + 2) = uVar5 << 8 | uVar5 >> 8;
    *(ushort *)(dst + sVar1 + 4) = uVar4 << 8 | uVar4 >> 8;
    *(ushort *)(dst + sVar1 + 6) = uVar6 * 0x100 | uVar6 >> 8;
    *offset = sVar1 + 8;
    for (p_Var3 = (font->tables)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        bVar7 = (_Rb_tree_header *)p_Var3 == &(font->tables)._M_t._M_impl.super__Rb_tree_header,
        !bVar7; p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
      bVar2 = WriteTable((Table *)&p_Var3[1]._M_parent,offset,dst,dst_size);
      if (!bVar2) {
        return bVar7;
      }
    }
  }
  return bVar7;
}

Assistant:

bool WriteFont(const Font& font, size_t* offset, uint8_t* dst,
               size_t dst_size) {
  if (dst_size < 12ULL + 16ULL * font.num_tables) {
    return FONT_COMPRESSION_FAILURE();
  }
  StoreU32(font.flavor, offset, dst);
  Store16(font.num_tables, offset, dst);
  uint16_t max_pow2 = font.num_tables ? Log2Floor(font.num_tables) : 0;
  uint16_t search_range = max_pow2 ? 1 << (max_pow2 + 4) : 0;
  uint16_t range_shift = (font.num_tables << 4) - search_range;
  Store16(search_range, offset, dst);
  Store16(max_pow2, offset, dst);
  Store16(range_shift, offset, dst);

  for (const auto& i : font.tables) {
    if (!WriteTable(i.second, offset, dst, dst_size)) {
      return false;
    }
  }

  return true;
}